

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

void __thiscall
Lodtalk::StackInterpreter::activateMethodFrame(StackInterpreter *this,CompiledMethod *newMethod)

{
  uint uVar1;
  StackMemory *pSVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar1 = *(uint *)&newMethod[1].super_ByteArray.super_ArrayedCollection.
                    super_SequenceableCollection.super_Collection.super_Object.super_ProtoObject.
                    object_header_;
  uVar7 = (ulong)(uVar1 >> 0x19 & 0xf);
  uVar6 = (ulong)(uVar1 >> 0x13 & 0x3f);
  pSVar2 = this->stack;
  puVar3 = (pSVar2->stackFrame).stackPointer;
  uVar4 = *(undefined8 *)(puVar3 + uVar7 * 8 + 8);
  (pSVar2->stackFrame).stackPointer = puVar3 + -8;
  *(uint8_t **)(puVar3 + -8) = (pSVar2->stackFrame).framePointer;
  pSVar2 = this->stack;
  puVar3 = (pSVar2->stackFrame).stackPointer;
  (pSVar2->stackFrame).framePointer = puVar3;
  (pSVar2->stackFrame).stackPointer = puVar3 + -8;
  *(CompiledMethod **)(puVar3 + -8) = newMethod;
  this->method = newMethod;
  pSVar2 = this->stack;
  puVar3 = (pSVar2->stackFrame).stackPointer;
  *(ulong *)(puVar3 + -8) = uVar7;
  (pSVar2->stackFrame).stackPointer = puVar3 + -0x10;
  *(undefined8 **)(puVar3 + -0x10) = &NilObject;
  puVar3 = (this->stack->stackFrame).stackPointer;
  (this->stack->stackFrame).stackPointer = puVar3 + -8;
  *(undefined8 *)(puVar3 + -8) = uVar4;
  while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
    puVar3 = (this->stack->stackFrame).stackPointer;
    (this->stack->stackFrame).stackPointer = puVar3 + -8;
    *(undefined8 **)(puVar3 + -8) = &NilObject;
  }
  garbageCollectionSafePoint(this);
  fetchFrameData(this);
  this->pc = (ulong)(*(uint *)&newMethod[1].super_ByteArray.super_ArrayedCollection.
                               super_SequenceableCollection.super_Collection.super_Object.
                               super_ProtoObject.object_header_ & 0x1fffe) * 4 + 0x10;
  checkStackOverflow(this);
  sVar5 = this->pc;
  this->pc = sVar5 + 1;
  this->nextOpcode =
       (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                              super_SequenceableCollection.super_Collection.super_Object.
                              super_ProtoObject.object_header_ + sVar5);
  return;
}

Assistant:

void StackInterpreter::activateMethodFrame(CompiledMethod *newMethod)
{
	// Get the method header
	auto header = *newMethod->getHeader();
	auto numArguments = header.getArgumentCount();
	auto numTemporals = header.getTemporalCount();

	// Get the receiver
	auto receiver = stackOopAtOffset((1 + numArguments)*sizeof(Oop));

	// Push the frame pointer.
	pushPointer(stack->getFramePointer()); // Return frame pointer.

	// Set the new frame pointer.
	stack->setFramePointer(stack->getStackPointer());

	// Push the method object.
	pushOop(Oop::fromPointer(newMethod));
	this->method = newMethod;

	// Encode frame metadata
	pushUInt(encodeFrameMetaData(false, false, numArguments));

	// Push the nil this context.
	pushOop(Oop());

	// Push the receiver oop.
	pushOop(receiver);

	// Push the nil temporals.
	for(size_t i = 0; i < numTemporals; ++i)
		pushOop(Oop());

    // Safe point for GC.
    garbageCollectionSafePoint();

	// Fetch the frame data.
	fetchFrameData();

	// Set the instruction pointer.
	pc = newMethod->getFirstPCOffset();

    // Check for stack overflow.
    checkStackOverflow();

	// Fetch the first instruction opcode
	fetchNextInstructionOpcode();
}